

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.c
# Opt level: O0

move_t SAN_parse_move(chess_state_t *state,char *san)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  int local_480;
  move_t move;
  int pos_from;
  char *s;
  uint local_450;
  int file;
  int rank;
  int pos_to;
  int type;
  int promotion_type;
  int is_capture;
  int len;
  int i;
  int num_moves;
  move_t num_candidates;
  move_t candidate;
  move_t moves [256];
  char *san_local;
  chess_state_t *state_local;
  
  num_moves = 0;
  i = 0;
  pos_to = 0;
  local_450 = 0xffffffff;
  s._4_4_ = 0xffffffff;
  sVar4 = strlen(san);
  promotion_type = (int)sVar4;
  iVar2 = STATE_generate_moves_simple(state,&num_candidates);
  switch(*san) {
  case 'B':
    rank = 2;
    break;
  default:
    rank = 0;
    break;
  case 'K':
  case 'O':
    rank = 5;
    break;
  case 'N':
    rank = 1;
    break;
  case 'Q':
    rank = 4;
    break;
  case 'R':
    rank = 3;
  }
  if (rank == 5) {
    iVar3 = strncmp(san,"O-O-O",5);
    if (iVar3 == 0) {
      is_capture = 0;
      while( true ) {
        if (iVar2 <= is_capture) {
          return 0;
        }
        if (((&num_candidates)[is_capture] & 0x3c0000) == 0xc0000) break;
        is_capture = is_capture + 1;
      }
      return (&num_candidates)[is_capture];
    }
    iVar3 = strncmp(san,"O-O",3);
    if (iVar3 == 0) {
      is_capture = 0;
      while( true ) {
        if (iVar2 <= is_capture) {
          return 0;
        }
        if (((&num_candidates)[is_capture] & 0x3c0000) == 0x80000) break;
        is_capture = is_capture + 1;
      }
      return (&num_candidates)[is_capture];
    }
  }
  pcVar5 = strchr(san,0x78);
  bVar8 = pcVar5 != (char *)0x0;
  if ((((rank == 0) && (bVar8)) && (5 < promotion_type)) &&
     (iVar3 = strcmp(san + (long)promotion_type + -5," e.p."), iVar3 == 0)) {
    promotion_type = promotion_type + -5;
  }
  if (san[promotion_type + -1] == '+') {
    promotion_type = promotion_type + -1;
  }
  if (san[promotion_type + -1] == '#') {
    promotion_type = promotion_type + -1;
  }
  if ((rank == 0) && (pcVar5 = strchr(san,0x3d), pcVar5 != (char *)0x0)) {
    switch(san[promotion_type + -1]) {
    case 'B':
      pos_to = 2;
      break;
    default:
      return 0;
    case 'N':
      pos_to = 1;
      break;
    case 'Q':
      pos_to = 4;
      break;
    case 'R':
      pos_to = 3;
    }
    promotion_type = promotion_type + -2;
  }
  iVar6 = promotion_type + -2;
  iVar7 = promotion_type + -1;
  iVar3 = promotion_type + -2;
  if (bVar8) {
    iVar3 = promotion_type + -3;
  }
  promotion_type = iVar3;
  if (((rank == 0) && (0 < promotion_type)) || ((rank != 0 && (1 < promotion_type)))) {
    _move = san;
    if (rank != 0) {
      _move = san + 1;
      promotion_type = promotion_type + -1;
    }
    for (is_capture = 0; is_capture < promotion_type; is_capture = is_capture + 1) {
      if ((_move[is_capture] < 'a') || ('h' < _move[is_capture])) {
        if (('0' < _move[is_capture]) && (_move[is_capture] < '9')) {
          local_450 = (int)_move[is_capture] - 0x31;
        }
      }
      else {
        s._4_4_ = (int)_move[is_capture] - 0x61;
      }
    }
  }
  is_capture = 0;
  do {
    if (iVar2 <= is_capture) {
      if (i == 1) {
        state_local._4_4_ = num_moves;
      }
      else {
        state_local._4_4_ = 0;
      }
      return state_local._4_4_;
    }
    uVar1 = (&num_candidates)[is_capture];
    if (((uVar1 & 0x7000) >> 0xc == rank) && (((uVar1 & 0x100000) != 0) == bVar8)) {
      if (pos_to != 0) {
        if (((uVar1 & 0x3c0000) >> 0x12 & 8) == 0) {
          local_480 = 0;
        }
        else {
          local_480 = ((uVar1 & 0x3c0000) >> 0x12 & 0xb) - 7;
        }
        if (pos_to != local_480) goto LAB_00105cc0;
      }
      if ((((uVar1 & 0xfc0) >> 6 == san[iVar6] + -0x61 + (san[iVar7] + -0x31) * 8) &&
          (((int)local_450 < 0 || ((uVar1 & 0x3f) / 8 == local_450)))) &&
         (((int)s._4_4_ < 0 || ((uVar1 & 0x3f) % 8 == s._4_4_)))) {
        i = i + 1;
        num_moves = uVar1;
      }
    }
LAB_00105cc0:
    is_capture = is_capture + 1;
  } while( true );
}

Assistant:

move_t SAN_parse_move(const chess_state_t *state, const char *san)
{
    move_t moves[256];
    move_t candidate = 0;
    move_t num_candidates = 0;
    int num_moves;
    int i;
    int len;
    int is_capture = 0;
    int promotion_type = 0;
    int type = PAWN;
    int pos_to = 0;
    int rank = -1;
    int file = -1;
    
    len = (int)strlen(san);
    
    /* Generate all possible moves */
    num_moves = STATE_generate_moves_simple(state, moves);
    
    /* What type of piece is moving? */
    switch(san[0]) {
    case 'N':
        type = KNIGHT;
        break;
    case 'B':
        type = BISHOP;
        break;
    case 'R':
        type = ROOK;
        break;
    case 'Q':
        type = QUEEN;
        break;
    case 'K':
    case 'O':
        type = KING;
        break;
    default:
        type = PAWN;
        break;
    }
    
    if(type == KING) {
        /* Is this a kingside castling? */
        if(strncmp(san, "O-O-O", 5) == 0) {
            for(i = 0; i < num_moves; i++) {
                if(MOVE_GET_SPECIAL_FLAGS(moves[i]) == MOVE_QUEEN_CASTLE) {
                    return moves[i];
                }
            }
            /* Failure */
            return 0;
        }
        
        /* Is this a queenside castling? */
        if(strncmp(san, "O-O", 3) == 0) {
            for(i = 0; i < num_moves; i++) {
                if(MOVE_GET_SPECIAL_FLAGS(moves[i]) == MOVE_KING_CASTLE) {
                    return moves[i];
                }
            }
            /* Failure */
            return 0;
        }
    }
    
    /* Is this move a capture? */
    is_capture = (strchr(san, 'x') != 0);
    
    /* Is this move an en passant capture? */
    if(type == PAWN && is_capture && len > 5) {
        if(strcmp(san+len-5, " e.p.") == 0) {
            len -= 5;
        }
    }
    
    /* Is this move a check? */
    if(san[len-1] == '+') {
        len -= 1;
    }

    /* Is this move a check mate? */
    if(san[len-1] == '#') {
        len -= 1;
    }
    
    /* Is this move a pawn promotion? */
    if(type == PAWN && strchr(san, '=')) {
        /* To what piece? */
        switch(san[len-1]) {
        case 'N':
            promotion_type = KNIGHT;
            break;
        case 'B':
            promotion_type = BISHOP;
            break;
        case 'R':
            promotion_type = ROOK;
            break;
        case 'Q':
            promotion_type = QUEEN;
            break;
        default:
        /* Failure */
            return 0;
        }
        
        len -= 2;
    }
    
    /* To what square is the piece moving? */
    pos_to = (san[len-2]-'a') + (san[len-1]-'1') * 8;
    len -= 2;
    
    if(is_capture) {
        len -= 1;
    }
    
    /* Check from file/rank/square */
    if((type == PAWN && len > 0 ) || (type != PAWN && len > 1)) {
        const char *s = san;
        if(type != PAWN) {
            s += 1;
            len -= 1;
        }
        
        for(i = 0; i < len; i++) {
            if(s[i] >= 'a' && s[i] <= 'h') {
                file = s[i] - 'a';
            } else if(s[i] >= '1' && s[i] <= '8') {
                rank = s[i] - '1';
            }
        }
    }

    /* Find candidate move */
    for(i = 0; i < num_moves; i++) {
        int pos_from;
        move_t move = moves[i];
        
        if(MOVE_GET_TYPE(move) != type) continue;
        if((MOVE_IS_CAPTURE(move) != 0) != is_capture) continue;
        if(promotion_type && promotion_type != MOVE_PROMOTION_TYPE(move)) continue;
        if(MOVE_GET_POS_TO(move) != pos_to) continue;
        pos_from = MOVE_GET_POS_FROM(move);
        if(rank >= 0 && pos_from / 8 != rank) continue;
        if(file >= 0 && pos_from % 8 != file) continue;

        num_candidates++;
        candidate = move;
    }

    if(num_candidates == 1) {
        return candidate;
    } else {
        /* Failure */
        return 0;
    }
}